

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void av1_free_restoration_buffers(AV1_COMMON *cm)

{
  long in_RDI;
  RestorationStripeBoundaries *boundaries;
  int p;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    av1_free_restoration_struct((RestorationInfo *)0x6b14c5);
  }
  aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x5ae0) = 0;
  aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x5ae8) = 0;
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffe8 = (YV12_BUFFER_CONFIG *)(in_RDI + (long)iVar1 * 0x40 + 0x5a40);
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    in_stack_ffffffffffffffe8->field_0 = (anon_union_8_2_2fc10223_for_yv12_buffer_config_0)0x0;
    in_stack_ffffffffffffffe8->field_1 = (anon_union_8_2_70c94c84_for_yv12_buffer_config_2)0x0;
  }
  aom_free_frame_buffer(in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void av1_free_restoration_buffers(AV1_COMMON *cm) {
  int p;
  for (p = 0; p < MAX_MB_PLANE; ++p)
    av1_free_restoration_struct(&cm->rst_info[p]);
  aom_free(cm->rst_tmpbuf);
  cm->rst_tmpbuf = NULL;
  aom_free(cm->rlbs);
  cm->rlbs = NULL;
  for (p = 0; p < MAX_MB_PLANE; ++p) {
    RestorationStripeBoundaries *boundaries = &cm->rst_info[p].boundaries;
    aom_free(boundaries->stripe_boundary_above);
    aom_free(boundaries->stripe_boundary_below);
    boundaries->stripe_boundary_above = NULL;
    boundaries->stripe_boundary_below = NULL;
  }

  aom_free_frame_buffer(&cm->rst_frame);
}